

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepFace::~ON_BrepFace(ON_BrepFace *this)

{
  ON_BrepFace *this_local;
  
  ~ON_BrepFace(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

ON_BrepFace::~ON_BrepFace()
{
  DestroyMesh(ON::any_mesh);
  m_li.Destroy();
  delete m_pImpl;
}